

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

void decode_nvrm_ioctl_create(nvrm_ioctl_create *s,mmt_memory_dump *args,int argc)

{
  code *UNRECOVERED_JUMPTABLE;
  FILE *__stream;
  char *pcVar1;
  mmt_buf *buf;
  long lVar2;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_pfx,(ulong)s->cls);
  pcVar1 = nvrm_get_class_name(s->cls);
  if (pcVar1 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar1);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%sparent: 0x%08x",nvrm_sep,(ulong)s->parent);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->parent,"parent");
  if (s->ptr == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr: %s",nvrm_pfx,"NULL");
  }
  else {
    fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx);
    if ((argc < 1) || (buf = find_ptr(s->ptr,args,argc), buf == (mmt_buf *)0x0)) {
      fputs(" [no data]",_stdout);
      buf = (mmt_buf *)0x0;
    }
  }
  __stream = _stdout;
  pcVar1 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf == (mmt_buf *)0x0) {
    return;
  }
  if (0 < (long)nvrm_create_arg_decoder_cnt) {
    lVar2 = 0;
    do {
      if (*(uint32_t *)((long)&nvrm_create_arg_decoders[0].cls + lVar2) == s->cls) {
        if (*(uint32_t *)((long)&nvrm_create_arg_decoders[0].size + lVar2) == buf->len) {
          nvrm_pfx = "";
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG:         %s","ptr[]: ");
          }
          else {
            fprintf(_stdout,"%64s        %s"," ","ptr[]: ");
          }
          UNRECOVERED_JUMPTABLE = *(code **)((long)&nvrm_create_arg_decoders[0].fun + lVar2);
          if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(s,buf + 1);
          return;
        }
        break;
      }
      lVar2 = lVar2 + 0x10;
    } while ((long)nvrm_create_arg_decoder_cnt * 0x10 != lVar2);
  }
  dump_mmt_buf_as_words_horiz(buf,"ptr[]:");
  return;
}

Assistant:

static void decode_nvrm_ioctl_create(struct nvrm_ioctl_create *s, struct mmt_memory_dump *args, int argc)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	struct mmt_buf *data = nvrm_print_ptr(s, ptr, args, argc);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_ln();

	if (data)
	{
		int found = 0;

		void (*fun)(struct nvrm_ioctl_create *, void *) = NULL;

		struct nvrm_create_arg_decoder *dec;
		int k;
		for (k = 0; k < nvrm_create_arg_decoder_cnt; ++k)
		{
			dec = &nvrm_create_arg_decoders[k];
			if (dec->cls == s->cls)
			{
				if (dec->size == data->len)
				{
					nvrm_reset_pfx();
					mmt_log("        %s", "ptr[]: ");
					fun = dec->fun;
					if (fun)
						fun(s, (void *)data->data);

					found = 1;
				}
				break;
			}
		}

		if (!found)
			dump_mmt_buf_as_words_horiz(data, "ptr[]:");
	}
}